

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O1

_Bool rtosc_valid_message_p(char *msg,size_t len)

{
  char cVar1;
  ushort **ppuVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  _Bool _Var9;
  ring_t local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (*msg != '/') {
    return false;
  }
  pcVar7 = msg;
  if (len != 0) {
    uVar5 = 1;
    do {
      cVar1 = *pcVar7;
      if ((long)cVar1 == 0) break;
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x40) == 0) goto LAB_0011212f;
      pcVar7 = pcVar7 + 1;
      bVar8 = uVar5 < len;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar8);
  }
  uVar3 = (long)pcVar7 - (long)msg;
  uVar5 = uVar3;
  uVar6 = uVar3;
  for (; (uVar5 < len && (uVar6 = uVar5, *pcVar7 != ',')); pcVar7 = pcVar7 + 1) {
    uVar5 = uVar5 + 1;
    uVar6 = len;
  }
  if ((uVar6 & 3) == 0 && uVar6 - uVar3 < 5) {
    local_38 = 0;
    uStack_30 = 0;
    local_48.data = msg;
    local_48.len = len;
    sVar4 = rtosc_message_ring_length(&local_48);
    _Var9 = sVar4 == len;
  }
  else {
LAB_0011212f:
    _Var9 = false;
  }
  return _Var9;
}

Assistant:

bool rtosc_valid_message_p(const char *msg, size_t len)
{
    //Validate Path Characters (assumes printable characters are sufficient)
    if(*msg != '/')
        return false;
    const char *tmp = msg;
    for(unsigned i=0; i<len; ++i) {
        if(*tmp == 0)
            break;
        if(!isprint(*tmp))
            return false;
        tmp++;
    }

    //tmp is now either pointing to a null or the end of the string
    const size_t offset1 = tmp-msg;
    size_t       offset2 = tmp-msg;
    for(; offset2<len; offset2++) {
        if(*tmp == ',')
            break;
        tmp++;
    }

    //Too many NULL bytes
    if(offset2-offset1 > 4)
        return false;

    if((offset2 % 4) != 0)
        return false;

    size_t observed_length = rtosc_message_length(msg, len);
    return observed_length == len;
}